

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
spirv_cross::Compiler::update_name_cache
          (Compiler *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cache_primary,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cache_secondary,string *name)

{
  undefined8 *puVar1;
  _Hash_node_base *p_Var2;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  iterator iVar8;
  undefined8 *puVar9;
  const_iterator cVar10;
  uint uVar11;
  _Hash_node_base _Var12;
  _Hash_node_base *p_Var13;
  __hashtable *__h;
  uint __val;
  string __str_1;
  __node_gen_type __node_gen_1;
  string tmpname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Hash_node_base **local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  _Hash_node_base *local_a8 [2];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  char *local_78;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  long local_68;
  __node_base local_50;
  size_type local_48;
  _Hash_node_base local_40 [2];
  
  if (name->_M_string_length != 0) {
    iVar8 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&cache_primary->_M_h,name);
    if ((iVar8.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur == (__node_type *)0x0) &&
       ((cache_primary == cache_secondary ||
        (cVar10 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&cache_secondary->_M_h,name),
        cVar10.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0)))) {
      local_70 = cache_primary;
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)cache_primary,name);
    }
    else {
      local_70 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffa0;
      pcVar3 = (name->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + name->_M_string_length);
      iVar7 = ::std::__cxx11::string::compare((char *)&local_70);
      if (iVar7 == 0) {
        local_78 = "_";
        ::std::__cxx11::string::append((char *)&local_70);
      }
      else {
        local_78 = "_";
        if (*(char *)((long)local_70 + local_68 + -1) == '_') {
          local_78 = "";
        }
      }
      __val = 0;
      do {
        local_50._M_nxt = local_40;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_70,
                   (undefined1 *)((long)&(local_70->_M_h)._M_buckets + local_68));
        ::std::__cxx11::string::append((char *)&local_50);
        __val = __val + 1;
        cVar6 = '\x01';
        if (9 < __val) {
          uVar11 = __val;
          cVar5 = '\x04';
          do {
            cVar6 = cVar5;
            if (uVar11 < 100) {
              cVar6 = cVar6 + -2;
              goto LAB_00383708;
            }
            if (uVar11 < 1000) {
              cVar6 = cVar6 + -1;
              goto LAB_00383708;
            }
            if (uVar11 < 10000) goto LAB_00383708;
            bVar4 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar5 = cVar6 + '\x04';
          } while (bVar4);
          cVar6 = cVar6 + '\x01';
        }
LAB_00383708:
        local_b8 = local_a8;
        ::std::__cxx11::string::_M_construct((ulong)&local_b8,cVar6);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,local_b0,__val);
        _Var12._M_nxt = (_Hash_node_base *)0xf;
        if (local_50._M_nxt != local_40) {
          _Var12._M_nxt = local_40[0]._M_nxt;
        }
        p_Var2 = (_Hash_node_base *)(CONCAT44(uStack_ac,local_b0) + local_48);
        if (_Var12._M_nxt < p_Var2) {
          p_Var13 = (_Hash_node_base *)0xf;
          if (local_b8 != local_a8) {
            p_Var13 = local_a8[0];
          }
          if (p_Var13 < p_Var2) goto LAB_0038377c;
          puVar9 = (undefined8 *)
                   ::std::__cxx11::string::replace
                             ((ulong)&local_b8,0,(char *)0x0,(ulong)local_50._M_nxt);
        }
        else {
LAB_0038377c:
          puVar9 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b8);
        }
        local_98 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88;
        puVar1 = puVar9 + 2;
        if ((undefined8 *)*puVar9 == puVar1) {
          local_88 = *puVar1;
          uStack_80 = puVar9[3];
        }
        else {
          local_88 = *puVar1;
          local_98 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)*puVar9;
        }
        local_90 = puVar9[1];
        *puVar9 = puVar1;
        puVar9[1] = 0;
        *(undefined1 *)puVar1 = 0;
        ::std::__cxx11::string::operator=((string *)name,(string *)&local_98);
        if (local_98 !=
            (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88) {
          operator_delete(local_98);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        if (local_50._M_nxt != local_40) {
          operator_delete(local_50._M_nxt);
        }
        iVar8 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&cache_primary->_M_h,name);
      } while ((iVar8.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) ||
              ((cache_primary != cache_secondary &&
               (cVar10 = ::std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(&cache_secondary->_M_h,name),
               cVar10.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur != (__node_type *)0x0))));
      local_98 = cache_primary;
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)cache_primary,name);
      if (local_70 !=
          (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&stack0xffffffffffffffa0) {
        operator_delete(local_70);
      }
    }
  }
  return;
}

Assistant:

void Compiler::update_name_cache(unordered_set<string> &cache_primary, const unordered_set<string> &cache_secondary,
                                 string &name)
{
	if (name.empty())
		return;

	const auto find_name = [&](const string &n) -> bool {
		if (cache_primary.find(n) != end(cache_primary))
			return true;

		if (&cache_primary != &cache_secondary)
			if (cache_secondary.find(n) != end(cache_secondary))
				return true;

		return false;
	};

	const auto insert_name = [&](const string &n) { cache_primary.insert(n); };

	if (!find_name(name))
	{
		insert_name(name);
		return;
	}

	uint32_t counter = 0;
	auto tmpname = name;

	bool use_linked_underscore = true;

	if (tmpname == "_")
	{
		// We cannot just append numbers, as we will end up creating internally reserved names.
		// Make it like _0_<counter> instead.
		tmpname += "0";
	}
	else if (tmpname.back() == '_')
	{
		// The last_character is an underscore, so we don't need to link in underscore.
		// This would violate double underscore rules.
		use_linked_underscore = false;
	}

	// If there is a collision (very rare),
	// keep tacking on extra identifier until it's unique.
	do
	{
		counter++;
		name = tmpname + (use_linked_underscore ? "_" : "") + convert_to_string(counter);
	} while (find_name(name));
	insert_name(name);
}